

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_match_owner.c
# Opt level: O0

void test_uid(void)

{
  wchar_t wVar1;
  archive_entry *entry;
  archive_entry *entry_00;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  archive *m;
  archive_entry *ae;
  void *in_stack_00000020;
  void *in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff8;
  
  entry = (archive_entry *)archive_match_new();
  wVar1 = assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                           (wchar_t)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                           (wchar_t)in_stack_fffffffffffffff8,(char *)entry,
                           in_stack_ffffffffffffffe8);
  if (wVar1 != L'\0') {
    entry_00 = archive_entry_new();
    wVar1 = assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                             (wchar_t)((ulong)entry_00 >> 0x20),(wchar_t)entry_00,(char *)entry,
                             in_stack_ffffffffffffffe8);
    if (wVar1 == L'\0') {
      archive_match_free((archive *)entry_00);
    }
    else {
      archive_match_include_uid((archive *)entry_00,(int64_t)entry);
      assertion_equal_int((char *)m,unaff_retaddr_00,(longlong)entry_00,(char *)entry,
                          (longlong)entry,(char *)0x1256e6,in_stack_00000020);
      archive_match_include_uid((archive *)entry_00,(int64_t)entry);
      assertion_equal_int((char *)m,unaff_retaddr_00,(longlong)entry_00,(char *)entry,
                          (longlong)entry,(char *)0x125724,in_stack_00000020);
      archive_entry_set_uid(entry_00,0);
      failure("uid 0 should be excluded");
      archive_match_owner_excluded((archive *)entry_00,entry);
      assertion_equal_int((char *)m,unaff_retaddr_00,(longlong)entry_00,(char *)entry,0,
                          (char *)0x125780,in_stack_00000020);
      archive_match_excluded(m,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
      assertion_equal_int((char *)m,unaff_retaddr_00,(longlong)entry_00,(char *)entry,0,
                          (char *)0x1257c0,in_stack_00000020);
      archive_entry_set_uid(entry_00,1000);
      failure("uid 1000 should not be excluded");
      archive_match_owner_excluded((archive *)entry_00,entry);
      assertion_equal_int((char *)m,unaff_retaddr_00,(longlong)entry_00,(char *)entry,0,
                          (char *)0x12581a,in_stack_00000020);
      archive_match_excluded(m,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
      assertion_equal_int((char *)m,unaff_retaddr_00,(longlong)entry_00,(char *)entry,0,
                          (char *)0x125857,in_stack_00000020);
      archive_entry_set_uid(entry_00,0x3e9);
      failure("uid 1001 should be excluded");
      archive_match_owner_excluded((archive *)entry_00,entry);
      assertion_equal_int((char *)m,unaff_retaddr_00,(longlong)entry_00,(char *)entry,0,
                          (char *)0x1258b4,in_stack_00000020);
      archive_match_excluded(m,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
      assertion_equal_int((char *)m,unaff_retaddr_00,(longlong)entry_00,(char *)entry,0,
                          (char *)0x1258f4,in_stack_00000020);
      archive_entry_set_uid(entry_00,0x3ea);
      failure("uid 1002 should not be excluded");
      archive_match_owner_excluded((archive *)entry_00,entry);
      assertion_equal_int((char *)m,unaff_retaddr_00,(longlong)entry_00,(char *)entry,0,
                          (char *)0x12594e,in_stack_00000020);
      archive_match_excluded(m,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
      assertion_equal_int((char *)m,unaff_retaddr_00,(longlong)entry_00,(char *)entry,0,
                          (char *)0x12598b,in_stack_00000020);
      archive_entry_set_uid(entry_00,0x3eb);
      failure("uid 1003 should be excluded");
      archive_match_owner_excluded((archive *)entry_00,entry);
      assertion_equal_int((char *)m,unaff_retaddr_00,(longlong)entry_00,(char *)entry,0,
                          (char *)0x1259e8,in_stack_00000020);
      archive_match_excluded(m,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
      assertion_equal_int((char *)m,unaff_retaddr_00,(longlong)entry_00,(char *)entry,0,
                          (char *)0x125a28,in_stack_00000020);
      archive_entry_free((archive_entry *)0x125a32);
      archive_match_free((archive *)entry_00);
    }
  }
  return;
}

Assistant:

static void
test_uid(void)
{
	struct archive_entry *ae;
	struct archive *m;

	if (!assert((m = archive_match_new()) != NULL))
		return;
	if (!assert((ae = archive_entry_new()) != NULL)) {
		archive_match_free(m);
		return;
	}

	assertEqualIntA(m, 0, archive_match_include_uid(m, 1000));
	assertEqualIntA(m, 0, archive_match_include_uid(m, 1002));

	archive_entry_set_uid(ae, 0);
	failure("uid 0 should be excluded");
	assertEqualInt(1, archive_match_owner_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));
	archive_entry_set_uid(ae, 1000);
	failure("uid 1000 should not be excluded");
	assertEqualInt(0, archive_match_owner_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));
	archive_entry_set_uid(ae, 1001);
	failure("uid 1001 should be excluded");
	assertEqualInt(1, archive_match_owner_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));
	archive_entry_set_uid(ae, 1002);
	failure("uid 1002 should not be excluded");
	assertEqualInt(0, archive_match_owner_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));
	archive_entry_set_uid(ae, 1003);
	failure("uid 1003 should be excluded");
	assertEqualInt(1, archive_match_owner_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));

	/* Clean up. */
	archive_entry_free(ae);
	archive_match_free(m);
}